

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::SerializeWithCachedSizes
          (FieldDescriptorProto *this,CodedOutputStream *output)

{
  bool bVar1;
  int32 value;
  FieldDescriptorProto_Label value_00;
  FieldDescriptorProto_Type value_01;
  int iVar2;
  char *pcVar3;
  string *psVar4;
  FieldOptions *value_02;
  UnknownFieldSet *pUVar5;
  CodedOutputStream *output_local;
  FieldDescriptorProto *this_local;
  
  bVar1 = has_name(this);
  if (bVar1) {
    name_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = name_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(1,psVar4,output);
  }
  bVar1 = has_extendee(this);
  if (bVar1) {
    extendee_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    extendee_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = extendee_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(2,psVar4,output);
  }
  bVar1 = has_number(this);
  if (bVar1) {
    value = number(this);
    internal::WireFormatLite::WriteInt32(3,value,output);
  }
  bVar1 = has_label(this);
  if (bVar1) {
    value_00 = label(this);
    internal::WireFormatLite::WriteEnum(4,value_00,output);
  }
  bVar1 = has_type(this);
  if (bVar1) {
    value_01 = type(this);
    internal::WireFormatLite::WriteEnum(5,value_01,output);
  }
  bVar1 = has_type_name(this);
  if (bVar1) {
    type_name_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    type_name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = type_name_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(6,psVar4,output);
  }
  bVar1 = has_default_value(this);
  if (bVar1) {
    default_value_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    default_value_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = default_value_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(7,psVar4,output);
  }
  bVar1 = has_options(this);
  if (bVar1) {
    value_02 = options(this);
    internal::WireFormatLite::WriteMessageMaybeToArray(8,(MessageLite *)value_02,output);
  }
  pUVar5 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar5);
  if (!bVar1) {
    pUVar5 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar5,output);
  }
  return;
}

Assistant:

void FieldDescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->name(), output);
  }

  // optional string extendee = 2;
  if (has_extendee()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->extendee().data(), this->extendee().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->extendee(), output);
  }

  // optional int32 number = 3;
  if (has_number()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(3, this->number(), output);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if (has_label()) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      4, this->label(), output);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if (has_type()) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      5, this->type(), output);
  }

  // optional string type_name = 6;
  if (has_type_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->type_name().data(), this->type_name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      6, this->type_name(), output);
  }

  // optional string default_value = 7;
  if (has_default_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->default_value().data(), this->default_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      7, this->default_value(), output);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if (has_options()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      8, this->options(), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}